

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.h
# Opt level: O2

void __thiscall bidirectional::Search::replaceBestLabel(Search *this,int *lemon_id,Label *label)

{
  int iVar1;
  pointer psVar2;
  element_type *peVar3;
  Vertex VVar4;
  shared_ptr<labelling::Label> label_ptr;
  element_type *local_28;
  Vertex local_20;
  
  std::make_shared<labelling::Label,labelling::Label_const&>((Label *)&stack0xffffffffffffffd8);
  iVar1 = *lemon_id;
  psVar2 = (this->best_labels).
           super__Vector_base<std::shared_ptr<labelling::Label>,_std::allocator<std::shared_ptr<labelling::Label>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar3 = psVar2[iVar1].super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  psVar2[iVar1].super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_28;
  VVar4 = (Vertex)psVar2[iVar1].super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  psVar2[iVar1].super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20;
  local_28 = peVar3;
  local_20 = VVar4;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

void replaceBestLabel(const int& lemon_id, const labelling::Label& label) {
    auto label_ptr = std::make_shared<labelling::Label>(label);
    best_labels[lemon_id].swap(label_ptr);
  }